

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

void Gia_ManObjAddToFrontier(Swp_Man_t *p,int Id,Vec_Int_t *vFront)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  
  if (Id != 0) {
    iVar1 = Swp_ManObj2Lit(p,Id);
    if (iVar1 == 0) {
      pGVar2 = Gia_ManObj(p->pGia,Id);
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      iVar1 = Abc_Var2Lit(iVar1,(uint)((ulong)*(undefined8 *)pGVar2 >> 0x3f));
      Swp_ManSetObj2Lit(p,Id,iVar1);
      sat_solver_setnvars(p->pSat,p->nSatVars + 100);
      if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar2) {
        Vec_IntPush(vFront,Id);
        return;
      }
    }
  }
  return;
}

Assistant:

static void Gia_ManObjAddToFrontier( Swp_Man_t * p, int Id, Vec_Int_t * vFront )
{
    Gia_Obj_t * pObj;
    if ( Id == 0 || Swp_ManObj2Lit(p, Id) )
        return;
    pObj = Gia_ManObj( p->pGia, Id );
    Swp_ManSetObj2Lit( p, Id, Abc_Var2Lit(p->nSatVars++, pObj->fPhase) );
    sat_solver_setnvars( p->pSat, p->nSatVars + 100 );
    if ( Gia_ObjIsAnd(pObj) )
        Vec_IntPush( vFront, Id );
}